

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_andc_i64_arm(TCGContext_conflict *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2)

{
  TCGTemp *ts;
  TCGOp *pTVar1;
  uintptr_t o_1;
  uintptr_t o_2;
  uintptr_t o;
  
  ts = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I64,false);
  pTVar1 = tcg_emit_op_arm(tcg_ctx,INDEX_op_not_i64);
  pTVar1->args[0] = (TCGArg)ts;
  pTVar1->args[1] = (TCGArg)(arg2 + (long)tcg_ctx);
  pTVar1 = tcg_emit_op_arm(tcg_ctx,INDEX_op_and_i64);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)ts;
  tcg_temp_free_internal_arm(tcg_ctx,ts);
  return;
}

Assistant:

void tcg_gen_andc_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, TCGv_i64 arg2)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_andc_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg1), TCGV_LOW(tcg_ctx, arg2));
        tcg_gen_andc_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg1), TCGV_HIGH(tcg_ctx, arg2));
#elif TCG_TARGET_HAS_andc_i64
        tcg_gen_op3_i64(tcg_ctx, INDEX_op_andc_i64, ret, arg1, arg2);
#else
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_not_i64(tcg_ctx, t0, arg2);
        tcg_gen_and_i64(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
#endif
}